

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCut.c
# Opt level: O2

int If_CutCountTotalFanins(If_Man_t *p)

{
  abctime aVar1;
  Vec_Int_t *vLeaves;
  int *piVar2;
  uint *puVar3;
  abctime aVar4;
  abctime time;
  uint uVar5;
  uint uVar6;
  int i;
  
  aVar1 = Abc_Clock();
  vLeaves = (Vec_Int_t *)malloc(0x10);
  vLeaves->nCap = 100;
  piVar2 = (int *)malloc(400);
  vLeaves->pArray = piVar2;
  uVar5 = 0;
  uVar6 = 0;
  for (i = 0; i < p->vObjs->nSize; i = i + 1) {
    puVar3 = (uint *)Vec_PtrEntry(p->vObjs,i);
    if (((*puVar3 & 0xf) == 4) && (puVar3[3] != 0)) {
      uVar5 = uVar5 + *(byte *)((long)puVar3 + 0x6f);
      vLeaves->nSize = 0;
      If_CutFoundFanins_rec(*(If_Obj_t **)(puVar3 + 6),vLeaves);
      If_CutFoundFanins_rec(*(If_Obj_t **)(puVar3 + 8),vLeaves);
      uVar6 = uVar6 + vLeaves->nSize;
    }
  }
  Abc_Print(1,"Total cut inputs = %d. Total fanins incremental = %d.\n",(ulong)uVar5,(ulong)uVar6);
  aVar4 = Abc_Clock();
  Abc_PrintTime(0x813da9,(char *)(aVar4 - aVar1),time);
  free(vLeaves->pArray);
  free(vLeaves);
  return 1;
}

Assistant:

int If_CutCountTotalFanins( If_Man_t * p )
{
    If_Obj_t * pObj;
    Vec_Int_t * vLeaves;
    int i, nFaninsTotal = 0, Counter = 0;
    abctime clk = Abc_Clock();
    vLeaves = Vec_IntAlloc( 100 );
    If_ManForEachObj( p, pObj, i )
    {
        if ( If_ObjIsAnd(pObj) && pObj->nRefs )
        {
            nFaninsTotal += If_ObjCutBest(pObj)->nLeaves;
            Vec_IntClear( vLeaves );
            If_CutFoundFanins_rec( If_ObjFanin0(pObj), vLeaves );
            If_CutFoundFanins_rec( If_ObjFanin1(pObj), vLeaves );
            Counter += Vec_IntSize(vLeaves);
        }
    }
    Abc_Print( 1, "Total cut inputs = %d. Total fanins incremental = %d.\n", nFaninsTotal, Counter );
    Abc_PrintTime( 1, "Fanins", Abc_Clock() - clk );
    Vec_IntFree( vLeaves );
    return 1;
}